

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::Imputer::SerializeWithCachedSizes(Imputer *this,CodedOutputStream *output)

{
  DoubleVector *value;
  ReplaceValueUnion value_00;
  
  if (this->_oneof_case_[0] == 1) {
    google::protobuf::internal::WireFormatLite::WriteDouble
              (1,(this->ImputedValue_).imputeddoublevalue_,output);
  }
  if (this->_oneof_case_[0] == 2) {
    google::protobuf::internal::WireFormatLite::WriteInt64
              (2,(this->ImputedValue_).imputedint64value_,output);
  }
  if (this->_oneof_case_[0] == 3) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((char *)(((this->ImputedValue_).imputeddoublearray_)->super_MessageLite).
                       _vptr_MessageLite,
               *(int *)&(((this->ImputedValue_).imputeddoublearray_)->_internal_metadata_).
                        super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                        .ptr_,SERIALIZE,"CoreML.Specification.Imputer.imputedStringValue");
    if (this->_oneof_case_[0] == 3) {
      value = (this->ImputedValue_).imputeddoublearray_;
    }
    else {
      value = (DoubleVector *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    }
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(3,(string *)value,output);
  }
  if (this->_oneof_case_[0] == 4) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (4,&((this->ImputedValue_).imputeddoublearray_)->super_MessageLite,output);
  }
  if (this->_oneof_case_[0] == 5) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (5,&((this->ImputedValue_).imputeddoublearray_)->super_MessageLite,output);
  }
  if (this->_oneof_case_[0] == 6) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (6,&((this->ImputedValue_).imputeddoublearray_)->super_MessageLite,output);
  }
  if (this->_oneof_case_[0] == 7) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (7,&((this->ImputedValue_).imputeddoublearray_)->super_MessageLite,output);
  }
  if (this->_oneof_case_[1] == 0xb) {
    google::protobuf::internal::WireFormatLite::WriteDouble
              (0xb,(this->ReplaceValue_).replacedoublevalue_,output);
  }
  if (this->_oneof_case_[1] == 0xc) {
    google::protobuf::internal::WireFormatLite::WriteInt64
              (0xc,(this->ReplaceValue_).replaceint64value_,output);
  }
  if (this->_oneof_case_[1] == 0xd) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (*(char **)(this->ReplaceValue_).replaceint64value_,
               *(int *)((undefined8 *)(this->ReplaceValue_).replaceint64value_ + 1),SERIALIZE,
               "CoreML.Specification.Imputer.replaceStringValue");
    if (this->_oneof_case_[1] == 0xd) {
      value_00 = this->ReplaceValue_;
    }
    else {
      value_00 = (ReplaceValueUnion)
                 &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    }
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
              (0xd,(string *)value_00,output);
    return;
  }
  return;
}

Assistant:

void Imputer::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.Imputer)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // double imputedDoubleValue = 1;
  if (has_imputeddoublevalue()) {
    ::google::protobuf::internal::WireFormatLite::WriteDouble(1, this->imputeddoublevalue(), output);
  }

  // int64 imputedInt64Value = 2;
  if (has_imputedint64value()) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(2, this->imputedint64value(), output);
  }

  // string imputedStringValue = 3;
  if (has_imputedstringvalue()) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->imputedstringvalue().data(), this->imputedstringvalue().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.Imputer.imputedStringValue");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      3, this->imputedstringvalue(), output);
  }

  // .CoreML.Specification.DoubleVector imputedDoubleArray = 4;
  if (has_imputeddoublearray()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      4, *ImputedValue_.imputeddoublearray_, output);
  }

  // .CoreML.Specification.Int64Vector imputedInt64Array = 5;
  if (has_imputedint64array()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      5, *ImputedValue_.imputedint64array_, output);
  }

  // .CoreML.Specification.StringToDoubleMap imputedStringDictionary = 6;
  if (has_imputedstringdictionary()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      6, *ImputedValue_.imputedstringdictionary_, output);
  }

  // .CoreML.Specification.Int64ToDoubleMap imputedInt64Dictionary = 7;
  if (has_imputedint64dictionary()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      7, *ImputedValue_.imputedint64dictionary_, output);
  }

  // double replaceDoubleValue = 11;
  if (has_replacedoublevalue()) {
    ::google::protobuf::internal::WireFormatLite::WriteDouble(11, this->replacedoublevalue(), output);
  }

  // int64 replaceInt64Value = 12;
  if (has_replaceint64value()) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(12, this->replaceint64value(), output);
  }

  // string replaceStringValue = 13;
  if (has_replacestringvalue()) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->replacestringvalue().data(), this->replacestringvalue().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.Imputer.replaceStringValue");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      13, this->replacestringvalue(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.Imputer)
}